

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType res_typ,int nvar_der,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vars,DeriveFuncFab *der_func_fab,DeriveBoxMap bx_map,Interpolater *interp)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  *in_RDI;
  DeriveFuncFab *in_R8;
  value_type *in_R9;
  undefined4 in_stack_fffffffffffffee0;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *var_names;
  int in_stack_fffffffffffffefc;
  string *in_stack_ffffffffffffff00;
  DeriveRec *in_stack_ffffffffffffff08;
  IndexType in_stack_ffffffffffffff14;
  DeriveBoxMap in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  
  var_names = (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff08;
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function(in_RDI,(function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                     *)in_R9);
  DeriveRec::DeriveRec
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_ffffffffffffff14,
             in_stack_fffffffffffffefc,var_names,in_R8,in_stack_ffffffffffffff20,
             (Interpolater *)CONCAT44(in_EDX,in_stack_ffffffffffffff28));
  std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::push_back
            ((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)in_RDI,in_R9);
  DeriveRec::~DeriveRec((DeriveRec *)CONCAT44(in_ECX,in_stack_fffffffffffffee0));
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
               *)0x1113520);
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               res_typ,
                 int                     nvar_der,
                 Vector<std::string> const&    vars,
                 DeriveFuncFab           der_func_fab,
                 DeriveRec::DeriveBoxMap bx_map,
                 Interpolater*           interp)
{
    lst.push_back(DeriveRec(name,res_typ,nvar_der,vars,der_func_fab,bx_map,interp));
}